

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  ImFontAtlasCustomRect *rect;
  ImFont **ppIVar1;
  bool bVar2;
  int local_34;
  float local_30;
  int i_1;
  ImVec2 uv1;
  ImVec2 uv0;
  ImFontAtlasCustomRect *r;
  int i;
  ImFontAtlas *atlas_local;
  
  bVar2 = true;
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    bVar2 = atlas->TexPixelsRGBA32 != (uint *)0x0;
  }
  if (bVar2) {
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);
    r._4_4_ = 0;
    do {
      if ((atlas->CustomRects).Size <= r._4_4_) {
        for (local_34 = 0; local_34 < (atlas->Fonts).Size; local_34 = local_34 + 1) {
          ppIVar1 = ImVector<ImFont_*>::operator[](&atlas->Fonts,local_34);
          if (((*ppIVar1)->DirtyLookupTables & 1U) != 0) {
            ppIVar1 = ImVector<ImFont_*>::operator[](&atlas->Fonts,local_34);
            ImFont::BuildLookupTable(*ppIVar1);
          }
        }
        atlas->TexReady = true;
        return;
      }
      rect = ImVector<ImFontAtlasCustomRect>::operator[](&atlas->CustomRects,r._4_4_);
      if ((rect->Font != (ImFont *)0x0) && (rect->GlyphID != 0)) {
        if (rect->Font->ContainerAtlas != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_draw.cpp"
                        ,0xaec,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        ImVec2::ImVec2(&uv1);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0);
        ImFontAtlas::CalcCustomRectUV(atlas,rect,&uv1,(ImVec2 *)&stack0xffffffffffffffd0);
        ImFont::AddGlyph(rect->Font,(ImFontConfig *)0x0,(ImWchar)rect->GlyphID,(rect->GlyphOffset).x
                         ,(rect->GlyphOffset).y,(rect->GlyphOffset).x + (float)rect->Width,
                         (rect->GlyphOffset).y + (float)rect->Height,uv1.x,uv1.y,local_30,(float)i_1
                         ,rect->GlyphAdvanceX);
      }
      r._4_4_ = r._4_4_ + 1;
    } while( true );
  }
  __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_draw.cpp"
                ,0xae0,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}